

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

value_type * __thiscall
QList<QRingChunk>::takeFirst(value_type *__return_storage_ptr__,QList<QRingChunk> *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  iterator iVar4;
  
  (__return_storage_ptr__->chunk).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->chunk).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->chunk).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->headOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->tailOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  iVar4 = begin(this);
  pDVar2 = ((iVar4.i)->chunk).d.d;
  pcVar3 = ((iVar4.i)->chunk).d.ptr;
  ((iVar4.i)->chunk).d.d = (Data *)0x0;
  ((iVar4.i)->chunk).d.ptr = (char *)0x0;
  (__return_storage_ptr__->chunk).d.d = pDVar2;
  (__return_storage_ptr__->chunk).d.ptr = pcVar3;
  qVar1 = ((iVar4.i)->chunk).d.size;
  ((iVar4.i)->chunk).d.size = 0;
  (__return_storage_ptr__->chunk).d.size = qVar1;
  qVar1 = (iVar4.i)->tailOffset;
  __return_storage_ptr__->headOffset = (iVar4.i)->headOffset;
  __return_storage_ptr__->tailOffset = qVar1;
  QtPrivate::QGenericArrayOps<QRingChunk>::eraseFirst((QGenericArrayOps<QRingChunk> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }